

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O0

void __thiscall Car::move(Car *this)

{
  bool bVar1;
  int iVar2;
  int y;
  int x;
  Car *local_10;
  Car *this_local;
  
  local_10 = this;
  while ((this->_active & 1U) != 0) {
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&y,&this->_delay);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&y);
    bVar1 = std::operator==(&this->_axis,"horizontal");
    if (bVar1) {
      iVar2 = get_xpos(this);
      iVar2 = newPos(this,iVar2);
      set_xpos(this,iVar2);
    }
    else {
      iVar2 = get_ypos(this);
      iVar2 = newPos(this,iVar2);
      set_ypos(this,iVar2);
    }
    iVar2 = get_xpos(this);
    if ((iVar2 < 0xf) && (iVar2 = get_ypos(this), iVar2 < 0xf)) {
      this->_active = false;
      this->_succeeded = true;
    }
  }
  iVar2 = get_xpos(this);
  if ((iVar2 < 0xf) && (iVar2 = get_ypos(this), iVar2 < 0xf)) {
    this->_succeeded = true;
  }
  return;
}

Assistant:

void Car::move(){
        // horizontal
        // vertical
        while(_active){
            std::this_thread::sleep_for(std::chrono::milliseconds(_delay));
            if (_axis == "horizontal"){
                int x = get_xpos();
                set_xpos( newPos(x));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---    Pos ="<< _xpos<<std::endl;
            }else{
                int y = get_ypos();
                set_ypos(newPos(y));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---   Pos = " <<_ypos<<std::endl;
            }
            // reached to  the correct place
            if(get_xpos()< 15 && get_ypos() <15)
                {   
                    _active = false;
                    _succeeded = true;
                }
        }
            // stopped in the correct place
              if(get_xpos()< 15 && get_ypos() <15)
                {
                    _succeeded = true;
                }

                //std::cout  << std::this_thread::get_id()<< " thread is ending\n"<< std::endl;
    }